

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O0

SampledSpectrum __thiscall pbrt::TabulatedBSSRDF::PDF_Sr(TabulatedBSSRDF *this,Float r)

{
  undefined8 uVar1;
  undefined8 uVar2;
  span<float> weights;
  span<float> weights_00;
  array<float,_4> aVar3;
  span<const_float> nodes;
  span<const_float> nodes_00;
  bool bVar4;
  const_reference pvVar5;
  Float *pFVar6;
  span<const_float> *in_RDI;
  float in_XMM0_Da;
  Float FVar7;
  undefined1 auVar8 [64];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  SampledSpectrum SVar14;
  size_t unaff_retaddr;
  int k;
  int j;
  Float rhoEff;
  Float sr;
  Float radiusWeights [4];
  Float rhoWeights [4];
  int radiusOffset;
  int rhoOffset;
  Float rOptical;
  int i;
  SampledSpectrum pdf;
  undefined4 in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  Float in_stack_ffffffffffffff3c;
  int radiusIndex;
  int rhoIndex;
  float fVar15;
  float local_68 [4];
  float local_58 [8];
  int local_38;
  float local_34;
  int local_30;
  int *in_stack_ffffffffffffffd8;
  float x;
  span<const_float> *psVar16;
  size_t in_stack_fffffffffffffff0;
  float *in_stack_fffffffffffffff8;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  psVar16 = in_RDI;
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c);
  local_30 = 0;
  while( true ) {
    auVar13 = in_ZMM1._8_56_;
    auVar11 = auVar8._8_56_;
    if (3 < local_30) break;
    x = in_XMM0_Da;
    auVar9._0_4_ = SampledSpectrum::operator[]
                             ((SampledSpectrum *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (int)in_stack_ffffffffffffff2c);
    auVar9._4_60_ = extraout_var;
    in_ZMM1 = ZEXT1664(auVar9._0_16_);
    local_34 = in_XMM0_Da * auVar9._0_4_;
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              (in_RDI,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_XMM0_Da));
    in_stack_ffffffffffffff3c =
         SampledSpectrum::operator[]
                   ((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                    ,(int)in_stack_ffffffffffffff2c);
    pstd::span<float>::span<4ul>
              ((span<float> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (float (*) [4])CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    auVar8 = ZEXT464(0);
    nodes.n = unaff_retaddr;
    nodes.ptr = in_stack_fffffffffffffff8;
    weights.n = in_stack_fffffffffffffff0;
    weights.ptr = (float *)psVar16;
    bVar4 = CatmullRomWeights(nodes,x,in_stack_ffffffffffffffd8,weights);
    if (bVar4) {
      pstd::span<float_const>::
      span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
                (in_RDI,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_XMM0_Da));
      in_stack_ffffffffffffff34 = local_34;
      pstd::span<float>::span<4ul>
                ((span<float> *)CONCAT44(local_34,in_stack_ffffffffffffff30),
                 (float (*) [4])CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      auVar8 = ZEXT464(0);
      nodes_00.n = unaff_retaddr;
      nodes_00.ptr = in_stack_fffffffffffffff8;
      weights_00.n = in_stack_fffffffffffffff0;
      weights_00.ptr = (float *)psVar16;
      bVar4 = CatmullRomWeights(nodes_00,x,in_stack_ffffffffffffffd8,weights_00);
      if (bVar4) {
        in_stack_ffffffffffffff2c = 0.0;
        fVar15 = 0.0;
        for (rhoIndex = 0; rhoIndex < 4; rhoIndex = rhoIndex + 1) {
          if ((local_58[rhoIndex] != 0.0) || (NAN(local_58[rhoIndex]))) {
            pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                (in_RDI[4].n + 0x60),(long)(local_38 + rhoIndex));
            fVar15 = *pvVar5 * local_58[rhoIndex] + fVar15;
            for (radiusIndex = 0; radiusIndex < 4; radiusIndex = radiusIndex + 1) {
              if ((local_68[radiusIndex] != 0.0) || (NAN(local_68[radiusIndex]))) {
                FVar7 = BSSRDFTable::EvalProfile
                                  ((BSSRDFTable *)CONCAT44(in_stack_ffffffffffffff2c,fVar15),
                                   rhoIndex,radiusIndex);
                in_stack_ffffffffffffff2c =
                     FVar7 * local_58[rhoIndex] * local_68[radiusIndex] + in_stack_ffffffffffffff2c;
              }
            }
          }
        }
        if ((local_34 != 0.0) || (NAN(local_34))) {
          in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c / (local_34 * 6.2831855);
        }
        FVar7 = SampledSpectrum::operator[]
                          ((SampledSpectrum *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (int)in_stack_ffffffffffffff2c);
        auVar10._0_4_ = Sqr<float>(FVar7);
        auVar10._4_60_ = extraout_var_00;
        in_ZMM1 = ZEXT1664(auVar10._0_16_);
        in_stack_ffffffffffffff30 = (in_stack_ffffffffffffff2c * auVar10._0_4_) / fVar15;
        pFVar6 = SampledSpectrum::operator[]
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (int)in_stack_ffffffffffffff2c);
        auVar8 = ZEXT464((uint)in_stack_ffffffffffffff30);
        *pFVar6 = in_stack_ffffffffffffff30;
      }
    }
    local_30 = local_30 + 1;
    in_XMM0_Da = x;
  }
  SVar14 = ClampZero((SampledSpectrum *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  auVar12._0_8_ = SVar14.values.values._8_8_;
  auVar12._8_56_ = auVar13;
  auVar8._0_8_ = SVar14.values.values._0_8_;
  auVar8._8_56_ = auVar11;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  uVar2 = vmovlpd_avx(auVar12._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

PBRT_CPU_GPU
    SampledSpectrum PDF_Sr(Float r) const {
        SampledSpectrum pdf(0.f);
        for (int i = 0; i < NSpectrumSamples; ++i) {
            // Convert $r$ into unitless optical radius $r_{\roman{optical}}$
            Float rOptical = r * sigma_t[i];

            // Compute spline weights to interpolate BSSRDF at _i_th wavelength
            int rhoOffset, radiusOffset;
            Float rhoWeights[4], radiusWeights[4];
            if (!CatmullRomWeights(table->rhoSamples, rho[i], &rhoOffset, rhoWeights) ||
                !CatmullRomWeights(table->radiusSamples, rOptical, &radiusOffset,
                                   radiusWeights))
                continue;

            // Set BSSRDF profile probability density for wavelength
            Float sr = 0, rhoEff = 0;
            for (int j = 0; j < 4; ++j)
                if (rhoWeights[j] != 0) {
                    // Update _rhoEff_ and _sr_ for wavelength
                    rhoEff += table->rhoEff[rhoOffset + j] * rhoWeights[j];
                    for (int k = 0; k < 4; ++k)
                        if (radiusWeights[k] != 0)
                            sr += table->EvalProfile(rhoOffset + j, radiusOffset + k) *
                                  rhoWeights[j] * radiusWeights[k];
                }
            // Cancel marginal PDF factor from tabulated BSSRDF profile
            if (rOptical != 0)
                sr /= 2 * Pi * rOptical;

            pdf[i] = sr * Sqr(sigma_t[i]) / rhoEff;
        }
        return ClampZero(pdf);
    }